

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
begin_class_state(callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  bool bVar1;
  QLoggingCategory *pQVar2;
  char *pcVar3;
  QDebug *pQVar4;
  reference pvVar5;
  element_type *peVar6;
  QMessageLogger local_120;
  QDebug local_100 [15];
  bool local_f1;
  undefined1 local_f0 [7];
  bool qt_category_enabled_3;
  undefined1 local_e0 [8];
  shared_ptr<MetaClass> old_parent;
  QDebug local_b0 [15];
  bool local_a1;
  undefined1 local_a0 [7];
  bool qt_category_enabled_2;
  QMessageLogger local_90;
  QDebug local_70 [11];
  bool local_65;
  bool qt_category_enabled_1;
  QMessageLogger local_58;
  QDebug local_38 [15];
  bool local_29;
  int *piStack_28;
  bool qt_category_enabled;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  piStack_28 = error;
  error_local = (int *)f;
  f_local = (ifstream *)conf;
  conf_local = (MetaConfiguration *)__return_storage_ptr__;
  pQVar2 = parser();
  local_29 = QLoggingCategory::isDebugEnabled(pQVar2);
  while (local_29 != false) {
    pQVar2 = parser();
    pcVar3 = QLoggingCategory::categoryName(pQVar2);
    QMessageLogger::QMessageLogger(&local_58,(char *)0x0,0,(char *)0x0,pcVar3);
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(local_38,"Starting class: ");
    operator<<(pQVar4,(string *)(anonymous_namespace)::global_string_abi_cxx11_);
    QDebug::~QDebug(local_38);
    local_29 = false;
  }
  std::istream::ignore();
  clear_empty((ifstream *)error_local);
  anon_unknown.dwarf_1cea4::trim((string *)(anonymous_namespace)::global_string_abi_cxx11_);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(f_local + 0x18));
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)(anonymous_namespace)::current_class);
    if (!bVar1) {
      __assert_fail("current_class",
                    "/workspace/llm4binary/github/license_c_cmakelists/tcanabrava[P]configuration-parser/parser/statemachine.cpp"
                    ,0x86,
                    "callback_t begin_class_state(MetaConfiguration &, std::ifstream &, int &)");
    }
    pQVar2 = parser();
    local_a1 = QLoggingCategory::isDebugEnabled(pQVar2);
    while (local_a1 != false) {
      pQVar2 = parser();
      pcVar3 = QLoggingCategory::categoryName(pQVar2);
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)
                 &old_parent.super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (char *)0x0,0,(char *)0x0,pcVar3);
      QMessageLogger::debug();
      pQVar4 = QDebug::operator<<(local_b0,"Creating a child class of");
      peVar6 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(anonymous_namespace)::current_class);
      operator<<(pQVar4,&peVar6->name);
      QDebug::~QDebug(local_b0);
      local_a1 = false;
    }
    std::shared_ptr<MetaClass>::shared_ptr
              ((shared_ptr<MetaClass> *)local_e0,
               (shared_ptr<MetaClass> *)(anonymous_namespace)::current_class);
    peVar6 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        (anonymous_namespace)::current_class);
    std::make_shared<MetaClass>();
    std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::push_back
              (&peVar6->subclasses,(value_type *)local_f0);
    std::shared_ptr<MetaClass>::~shared_ptr((shared_ptr<MetaClass> *)local_f0);
    peVar6 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        (anonymous_namespace)::current_class);
    pvVar5 = std::vector<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>::
             back(&peVar6->subclasses);
    std::shared_ptr<MetaClass>::operator=
              ((shared_ptr<MetaClass> *)(anonymous_namespace)::current_class,pvVar5);
    peVar6 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        (anonymous_namespace)::current_class);
    std::shared_ptr<MetaClass>::operator=(&peVar6->parent,(shared_ptr<MetaClass> *)local_e0);
    std::shared_ptr<MetaClass>::~shared_ptr((shared_ptr<MetaClass> *)local_e0);
  }
  else {
    pQVar2 = parser();
    local_65 = QLoggingCategory::isDebugEnabled(pQVar2);
    while (local_65 != false) {
      pQVar2 = parser();
      pcVar3 = QLoggingCategory::categoryName(pQVar2);
      QMessageLogger::QMessageLogger(&local_90,(char *)0x0,0,(char *)0x0,pcVar3);
      QMessageLogger::debug();
      QDebug::operator<<(local_70,"Creating the top level class");
      QDebug::~QDebug(local_70);
      local_65 = false;
    }
    std::make_shared<MetaClass>();
    std::shared_ptr<MetaClass>::operator=
              ((shared_ptr<MetaClass> *)(f_local + 0x18),(shared_ptr<MetaClass> *)local_a0);
    std::shared_ptr<MetaClass>::~shared_ptr((shared_ptr<MetaClass> *)local_a0);
    std::shared_ptr<MetaClass>::operator=
              ((shared_ptr<MetaClass> *)(anonymous_namespace)::current_class,
               (shared_ptr<MetaClass> *)(f_local + 0x18));
  }
  peVar6 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      (anonymous_namespace)::current_class);
  std::__cxx11::string::operator=
            ((string *)&peVar6->name,(string *)(anonymous_namespace)::global_string_abi_cxx11_);
  pQVar2 = parser();
  local_f1 = QLoggingCategory::isDebugEnabled(pQVar2);
  while (local_f1 != false) {
    pQVar2 = parser();
    pcVar3 = QLoggingCategory::categoryName(pQVar2);
    QMessageLogger::QMessageLogger(&local_120,(char *)0x0,0,(char *)0x0,pcVar3);
    QMessageLogger::debug();
    pQVar4 = QDebug::operator<<(local_100,"class found: ");
    peVar6 = std::__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<MetaClass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        (anonymous_namespace)::current_class);
    pQVar4 = operator<<(pQVar4,&peVar6->name);
    pQVar4 = QDebug::operator<<(pQVar4,", value = ");
    operator<<(pQVar4,(string *)(anonymous_namespace)::array_value_abi_cxx11_);
    QDebug::~QDebug(local_100);
    local_f1 = false;
  }
  std::__cxx11::string::clear();
  std::
  function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
  ::
  function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
            ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
              *)__return_storage_ptr__,class_state);
  return __return_storage_ptr__;
}

Assistant:

callback_t begin_class_state(MetaConfiguration &conf, std::ifstream &f,
                             int &error) {
  qCDebug(parser) << "Starting class: " << global_string;

  f.ignore(); // eat the '{' character.
  clear_empty(f);
  trim(global_string);

  if (!conf.top_level_class) {
    qCDebug(parser) << "Creating the top level class";
    conf.top_level_class = std::make_shared<MetaClass>();
    current_class = conf.top_level_class;
  } else {
    assert(current_class);
    qCDebug(parser) << "Creating a child class of" << current_class->name;
    auto old_parent = current_class;
    current_class->subclasses.push_back(std::make_shared<MetaClass>());
    current_class = current_class->subclasses.back();
    current_class->parent = old_parent;
  }
  current_class->name = global_string;

  qCDebug(parser) << "class found: " << current_class->name
                  << ", value = " << array_value;

  global_string.clear();
  return class_state;
}